

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

size_t mem_get_varsize(uint8_t *src,int sz)

{
  switch(sz) {
  case 1:
    return (ulong)*src;
  case 2:
    return (ulong)*(ushort *)src;
  case 3:
    return (ulong)*(uint3 *)src;
  case 4:
    return (ulong)*(uint *)src;
  default:
    return 0xffffffffffffffff;
  }
}

Assistant:

static size_t mem_get_varsize(const uint8_t *src, int sz) {
  switch (sz) {
    case 1: return src[0];
    case 2: return mem_get_le16(src);
    case 3: return mem_get_le24(src);
    case 4: return mem_get_le32(src);
    default: assert(0 && "Invalid size"); return -1;
  }
}